

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCCurve.cpp
# Opt level: O1

size_t __thiscall
Assimp::IFC::anon_unknown_9::Line::EstimateSampleCount(Line *this,IfcFloat a,IfcFloat b)

{
  int iVar1;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  IfcFloat IVar2;
  
  IVar2 = b;
  (*(this->super_Curve)._vptr_Curve[5])();
  iVar1 = (*(this->super_Curve)._vptr_Curve[2])(this);
  if (((char)iVar1 == '\0') &&
     ((a - extraout_XMM0_Qa <= -1.1920928955078125e-07 || (IVar2 - a <= -1.1920928955078125e-07))))
  {
    __assert_fail("InRange( a )",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/Importer/IFC/IFCCurve.cpp"
                  ,0xab,
                  "virtual size_t Assimp::IFC::(anonymous namespace)::Line::EstimateSampleCount(IfcFloat, IfcFloat) const"
                 );
  }
  IVar2 = a;
  (*(this->super_Curve)._vptr_Curve[5])(this);
  iVar1 = (*(this->super_Curve)._vptr_Curve[2])(this);
  if (((char)iVar1 == '\0') &&
     ((b - extraout_XMM0_Qa_00 <= -1.1920928955078125e-07 || (IVar2 - b <= -1.1920928955078125e-07))
     )) {
    __assert_fail("InRange( b )",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/Importer/IFC/IFCCurve.cpp"
                  ,0xac,
                  "virtual size_t Assimp::IFC::(anonymous namespace)::Line::EstimateSampleCount(IfcFloat, IfcFloat) const"
                 );
  }
  return 2 - (ulong)(a == b);
}

Assistant:

size_t EstimateSampleCount(IfcFloat a, IfcFloat b) const {
        ai_assert( InRange( a ) );
        ai_assert( InRange( b ) );
        // two points are always sufficient for a line segment
        return a==b ? 1 : 2;
    }